

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O3

Quaternion QuaternionLerp(Quaternion q1,Quaternion q2,float amount)

{
  Quaternion QVar1;
  
  QVar1.x = q1.x + amount * (q2.x - q1.x);
  QVar1.y = q1.y + amount * (q2.y - q1.y);
  QVar1.w = q1.w + amount * (q2.w - q1.w);
  QVar1.z = q1.z + amount * (q2.z - q1.z);
  return QVar1;
}

Assistant:

RMDEF Quaternion QuaternionLerp(Quaternion q1, Quaternion q2, float amount)
{
    Quaternion result = { 0 };

    result.x = q1.x + amount*(q2.x - q1.x);
    result.y = q1.y + amount*(q2.y - q1.y);
    result.z = q1.z + amount*(q2.z - q1.z);
    result.w = q1.w + amount*(q2.w - q1.w);

    return result;
}